

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O0

udword __thiscall Opcode::MeshInterface::CheckTopology(MeshInterface *this)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint local_54;
  udword i;
  VertexPointers VP;
  udword NbDegenerate;
  MeshInterface *this_local;
  IndexedTriangle *T;
  
  VP.Vertex[2]._4_4_ = 0;
  for (local_54 = 0; local_54 < this->mNbTris; local_54 = local_54 + 1) {
    piVar1 = (int *)((long)this->mTris->mVRef + (ulong)(local_54 * this->mTriStride));
    lVar2 = (long)&this->mVerts->x + (ulong)(*piVar1 * this->mVertexStride);
    lVar3 = (long)&this->mVerts->x + (ulong)(piVar1[1] * this->mVertexStride);
    lVar4 = (long)&this->mVerts->x + (ulong)(piVar1[2] * this->mVertexStride);
    if (((lVar2 == lVar3) || (lVar3 == lVar4)) || (lVar4 == lVar2)) {
      VP.Vertex[2]._4_4_ = VP.Vertex[2]._4_4_ + 1;
    }
  }
  return VP.Vertex[2]._4_4_;
}

Assistant:

udword MeshInterface::CheckTopology()	const
{
	// Check topology. If the model contains degenerate faces, collision report can be wrong in some cases.
	// e.g. it happens with the standard MAX teapot. So clean your meshes first... If you don't have a mesh cleaner
	// you can try this: www.codercorner.com/Consolidation.zip

	udword NbDegenerate = 0;

	VertexPointers VP;

	// Using callbacks, we don't have access to vertex indices. Nevertheless we still can check for
	// redundant vertex pointers, which cover all possibilities (callbacks/pointers/strides).
	for(udword i=0;i<mNbTris;i++)
	{
		GetTriangle(VP, i);

		if(		(VP.Vertex[0]==VP.Vertex[1])
			||	(VP.Vertex[1]==VP.Vertex[2])
			||	(VP.Vertex[2]==VP.Vertex[0]))	NbDegenerate++;
	}

	return NbDegenerate;
}